

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cpp
# Opt level: O0

token * skiwi::anon_unknown_2::take
                  (token *__return_storage_ptr__,
                  vector<skiwi::token,_std::allocator<skiwi::token>_> *tokens)

{
  bool bVar1;
  reference pvVar2;
  vector<skiwi::token,_std::allocator<skiwi::token>_> *tokens_local;
  token *t;
  
  bVar1 = std::vector<skiwi::token,_std::allocator<skiwi::token>_>::empty(tokens);
  if (bVar1) {
    throw_parse_error(no_tokens);
  }
  pvVar2 = std::vector<skiwi::token,_std::allocator<skiwi::token>_>::back(tokens);
  token::token(__return_storage_ptr__,pvVar2);
  token::operator=((token *)&(anonymous_namespace)::popped_token,__return_storage_ptr__);
  std::vector<skiwi::token,_std::allocator<skiwi::token>_>::pop_back(tokens);
  return __return_storage_ptr__;
}

Assistant:

token take(std::vector<token>& tokens)
    {
    if (tokens.empty())
      {
      throw_parse_error(no_tokens);
      }
    token t = tokens.back();
    popped_token = t;
    tokens.pop_back();
    return t;
    }